

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

TArray<F3DFloor_*,_F3DFloor_*> * __thiscall
TArray<F3DFloor_*,_F3DFloor_*>::operator=
          (TArray<F3DFloor_*,_F3DFloor_*> *this,TArray<F3DFloor_*,_F3DFloor_*> *other)

{
  TArray<F3DFloor_*,_F3DFloor_*> *other_local;
  TArray<F3DFloor_*,_F3DFloor_*> *this_local;
  
  if (other != this) {
    if (this->Array != (F3DFloor **)0x0) {
      if (this->Count != 0) {
        DoDelete(this,0,this->Count - 1);
      }
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}